

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

bool __thiscall branch_and_reduce_algorithm::fold2Reduction(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  pointer piVar2;
  pointer pvVar3;
  pointer piVar4;
  int *piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  FILE *__stream;
  uint uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  initializer_list<int> __l;
  allocator_type local_6d;
  int local_6c;
  vector<int,_std::allocator<int>_> copyOfTmp;
  allocator_type local_48 [24];
  
  uVar1 = this->rn;
  lVar9 = 0;
  do {
    __stream = _stderr;
    if (this->n <= lVar9) {
      uVar6 = this->rn;
      if ((2 < debug) && (uVar1 != uVar6 && this->depth <= this->maxDepth)) {
        debugString_abi_cxx11_((string *)&copyOfTmp,this);
        fprintf(__stream,"%sfold2: %d -> %d\n",
                copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,(ulong)uVar1,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&copyOfTmp);
        uVar6 = this->rn;
      }
      return uVar1 != uVar6;
    }
    piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (piVar2[lVar9] < 0) {
      pvVar3 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = *(pointer *)
                ((long)&pvVar3[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      iVar8 = 0;
      for (piVar7 = pvVar3[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar7 != piVar5; piVar7 = piVar7 + 1) {
        if (piVar2[*piVar7] < 0) {
          piVar4[iVar8] = *piVar7;
          if (1 < iVar8) goto LAB_0010a185;
          iVar8 = iVar8 + 1;
        }
      }
      if (1 < iVar8) {
        __first._M_current =
             (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        piVar7 = pvVar3[*__first._M_current].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (piVar7 == *(pointer *)
                         ((long)&pvVar3[*__first._M_current].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 8)) {
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)&copyOfTmp,__first,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (__first._M_current + 2),local_48);
            __l._M_len = 1;
            __l._M_array = &local_6c;
            local_6c = (int)lVar9;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_48,__l,&local_6d);
            compute_fold(this,(vector<int,_std::allocator<int>_> *)local_48,&copyOfTmp);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)local_48);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&copyOfTmp);
            goto LAB_0010a185;
          }
          iVar8 = *piVar7;
          piVar7 = piVar7 + 1;
        } while (iVar8 != __first._M_current[1]);
        set(this,(int)lVar9,0);
      }
    }
LAB_0010a185:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::fold2Reduction()
{
    int oldn = rn;
    std::vector<int> &tmp = level;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            int p = 0;
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    tmp[p++] = u;
                    if (p > 2)
                        goto loop;
                }
            if (p < 2)
                continue;
            for (int u : adj[tmp[0]])
                if (u == tmp[1]) // triangle
                {
                    set(v, 0);
                    goto loop;
                }
            {
                std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + 2);
                compute_fold(std::vector<int>{v}, copyOfTmp);
            }
        loop:;
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sfold2: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}